

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cc
# Opt level: O3

void __thiscall
TestSchema::printNext(TestSchema *this,Parser<avro::ReaderImpl<avro::Validator>_> *p)

{
  char cVar1;
  Validator *pVVar2;
  string fieldName;
  string recordName;
  char local_48 [16];
  char *local_38;
  long local_30;
  char local_28;
  undefined7 uStack_27;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Next: \"",7);
  avro::operator<<((ostream *)&std::cout,*(Type *)&(p->reader_).field_0x18);
  local_30 = 0;
  local_28 = '\0';
  local_48[0] = '\0';
  pVVar2 = &(p->reader_).validator_;
  local_38 = &local_28;
  cVar1 = avro::Validator::getCurrentRecordName((string *)pVVar2);
  if (cVar1 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" record: \"",0xb);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_38,local_30);
  }
  cVar1 = avro::Validator::getNextFieldName((string *)pVVar2);
  if (cVar1 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" field: \"",10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_48,0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\"\n",2);
  if (local_38 != &local_28) {
    operator_delete(local_38,CONCAT71(uStack_27,local_28) + 1);
  }
  return;
}

Assistant:

void printNext(Parser<ValidatingReader> &p)
    {
        std::cout << "Next: \"" << nextType(p);
        std::string recordName;
        std::string fieldName;
        if( currentRecordName(p, recordName) ) {
            std::cout << "\" record: \"" << recordName;
        }
        if( nextFieldName(p, fieldName) ) {
            std::cout << "\" field: \"" << fieldName;
        }
        std::cout << "\"\n";

    }